

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argumentUtils.cpp
# Opt level: O0

QFunctionJAOHInterface *
ArgumentUtils::GetQheuristicFromArgs(PlanningUnitDecPOMDPDiscrete *pu,Arguments *args)

{
  long *plVar1;
  QFunctionJAOHInterface *pQVar2;
  AlphaVectorPlanning *pAVar3;
  PlanningUnitDecPOMDPDiscrete *pu_00;
  QAV<TreeIncPruneBGPlanner> *this;
  undefined8 uVar4;
  ostream *poVar5;
  int *in_RSI;
  QBGPlanner_TreeIncPruneBnB *M_3;
  TreeIncPruneBGPlanner *M_2;
  Arguments args1_1;
  Arguments args1;
  MonahanBGPlanner *M_1;
  MonahanPOMDPPlanner *M;
  QFunctionJAOHInterface *q;
  Arguments *in_stack_00000708;
  PlanningUnitDecPOMDPDiscrete *in_stack_00000710;
  Arguments *in_stack_fffffffffffffa48;
  Arguments *in_stack_fffffffffffffa50;
  PlanningUnitDecPOMDPDiscrete *in_stack_fffffffffffffa58;
  string *psVar6;
  MonahanPOMDPPlanner *in_stack_fffffffffffffa60;
  PlanningUnitDecPOMDPDiscrete *in_stack_fffffffffffffa68;
  QMDP *in_stack_fffffffffffffa70;
  PlanningUnitDecPOMDPDiscrete *in_stack_fffffffffffffa78;
  TreeIncPruneBGPlanner *in_stack_fffffffffffffa80;
  PlanningUnitDecPOMDPDiscrete *in_stack_fffffffffffffa88;
  QAV<MonahanPOMDPPlanner> *in_stack_fffffffffffffa90;
  TreeIncPruneBGPlanner *in_stack_fffffffffffffaa0;
  QFunctionJAOHInterface *local_540;
  QFunctionJAOHInterface *local_528;
  QFunctionJAOHInterface *local_510;
  QFunctionJAOHInterface *local_4f0;
  string local_4d8 [32];
  TreeIncPruneBGPlanner *local_4b8;
  PlanningUnitDecPOMDPDiscrete *local_4b0;
  undefined4 local_360;
  undefined4 local_35c;
  undefined4 local_128;
  undefined4 local_124;
  AlphaVectorPlanning *local_38;
  AlphaVectorPlanning *local_30;
  QFunctionJAOHInterface *local_18;
  int *local_10;
  
  local_18 = (QFunctionJAOHInterface *)0x0;
  local_10 = in_RSI;
  switch(in_RSI[0x4e]) {
  case 0:
  case 0xb:
    plVar1 = (long *)operator_new(0x70);
    QMDP::QMDP(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,
               SUB81((ulong)in_stack_fffffffffffffa60 >> 0x38,0));
    local_4f0 = (QFunctionJAOHInterface *)0x0;
    if (plVar1 != (long *)0x0) {
      local_4f0 = (QFunctionJAOHInterface *)((long)plVar1 + *(long *)(*plVar1 + -0x98));
    }
    local_18 = local_4f0;
    break;
  case 1:
    pQVar2 = (QFunctionJAOHInterface *)operator_new(0x60);
    QPOMDP::QPOMDP((QPOMDP *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
    local_18 = pQVar2;
    break;
  case 2:
    pQVar2 = (QFunctionJAOHInterface *)operator_new(0x60);
    QBG::QBG((QBG *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
    local_18 = pQVar2;
    break;
  case 3:
    plVar1 = (long *)operator_new(0x70);
    QMDP::QMDP(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,
               SUB81((ulong)in_stack_fffffffffffffa60 >> 0x38,0));
    local_510 = (QFunctionJAOHInterface *)0x0;
    if (plVar1 != (long *)0x0) {
      local_510 = (QFunctionJAOHInterface *)((long)plVar1 + *(long *)(*plVar1 + -0x98));
    }
    local_18 = local_510;
    break;
  case 4:
    pAVar3 = (AlphaVectorPlanning *)operator_new(400);
    MonahanPOMDPPlanner::MonahanPOMDPPlanner
              (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
               SUB81((ulong)in_stack_fffffffffffffa50 >> 0x38,0));
    local_30 = pAVar3;
    AlphaVectorPlanning::SetAcceleratedPruningThreshold(pAVar3,*(size_t *)(local_10 + 0x56));
    plVar1 = (long *)operator_new(0x38);
    QAV<MonahanPOMDPPlanner>::QAV
              (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
               (MonahanPOMDPPlanner *)in_stack_fffffffffffffa80);
    local_528 = (QFunctionJAOHInterface *)0x0;
    if (plVar1 != (long *)0x0) {
      local_528 = (QFunctionJAOHInterface *)((long)plVar1 + *(long *)(*plVar1 + -0x90));
    }
    local_18 = local_528;
    break;
  case 5:
    pAVar3 = (AlphaVectorPlanning *)operator_new(400);
    MonahanBGPlanner::MonahanBGPlanner
              ((MonahanBGPlanner *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
               SUB81((ulong)in_stack_fffffffffffffa50 >> 0x38,0));
    local_38 = pAVar3;
    AlphaVectorPlanning::SetAcceleratedPruningThreshold(pAVar3,*(size_t *)(local_10 + 0x56));
    plVar1 = (long *)operator_new(0x38);
    QAV<MonahanBGPlanner>::QAV
              ((QAV<MonahanBGPlanner> *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
               &in_stack_fffffffffffffa80->super_MonahanBGPlanner);
    local_540 = (QFunctionJAOHInterface *)0x0;
    if (plVar1 != (long *)0x0) {
      local_540 = (QFunctionJAOHInterface *)((long)plVar1 + *(long *)(*plVar1 + -0x90));
    }
    local_18 = local_540;
    break;
  case 6:
    local_18 = GetHybridQheuristicFromArgs(in_stack_00000710,in_stack_00000708);
    break;
  case 7:
    ArgumentHandlers::Arguments::Arguments(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
    local_128 = 1;
    local_124 = 1;
    local_18 = GetHybridQheuristicFromArgs(in_stack_00000710,in_stack_00000708);
    ArgumentHandlers::Arguments::~Arguments((Arguments *)0x8e34d6);
    break;
  case 8:
    ArgumentHandlers::Arguments::Arguments(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
    local_360 = 2;
    local_35c = 2;
    local_18 = GetHybridQheuristicFromArgs(in_stack_00000710,in_stack_00000708);
    ArgumentHandlers::Arguments::~Arguments((Arguments *)0x8e3564);
    break;
  case 9:
    pu_00 = (PlanningUnitDecPOMDPDiscrete *)operator_new(0x290);
    TreeIncPruneBGPlanner::TreeIncPruneBGPlanner(in_stack_fffffffffffffaa0,pu_00);
    local_4b0 = pu_00;
    if ((*(byte *)(local_10 + 0x54) & 1) == 0) {
      TreeIncPruneBGPlanner::SetPruneAfterUnion((TreeIncPruneBGPlanner *)pu_00,false);
    }
    else {
      TreeIncPruneBGPlanner::SetPruneAfterUnion((TreeIncPruneBGPlanner *)pu_00,true);
    }
    if ((*(byte *)((long)local_10 + 0x151) & 1) == 0) {
      TreeIncPruneBGPlanner::SetPruneAfterCrossSum((TreeIncPruneBGPlanner *)local_4b0,false);
    }
    else {
      TreeIncPruneBGPlanner::SetPruneAfterCrossSum((TreeIncPruneBGPlanner *)local_4b0,true);
    }
    if ((*(byte *)((long)local_10 + 0x152) & 1) == 0) {
      TreeIncPruneBGPlanner::SetUseVectorCache((TreeIncPruneBGPlanner *)local_4b0,false);
    }
    else {
      TreeIncPruneBGPlanner::SetUseVectorCache((TreeIncPruneBGPlanner *)local_4b0,true);
    }
    this = (QAV<TreeIncPruneBGPlanner> *)operator_new(0x38);
    QAV<TreeIncPruneBGPlanner>::QAV(this,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
    local_18 = (QFunctionJAOHInterface *)0x0;
    if (this != (QAV<TreeIncPruneBGPlanner> *)0x0) {
      local_18 = (QFunctionJAOHInterface *)
                 (&(this->super_QFunctionJointBelief).super_QFunctionJointBeliefInterface.field_0x0
                 + *(long *)((long)(this->super_QFunctionJointBelief).
                                   super_QFunctionJointBeliefInterface + -0x90));
    }
    break;
  case 10:
    in_stack_fffffffffffffa80 = (TreeIncPruneBGPlanner *)operator_new(0x248);
    QBGPlanner_TreeIncPruneBnB::QBGPlanner_TreeIncPruneBnB
              ((QBGPlanner_TreeIncPruneBnB *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
    local_4b8 = in_stack_fffffffffffffa80;
    in_stack_fffffffffffffa78 = (PlanningUnitDecPOMDPDiscrete *)operator_new(0x38);
    QAV<QBGPlanner_TreeIncPruneBnB>::QAV
              ((QAV<QBGPlanner_TreeIncPruneBnB> *)in_stack_fffffffffffffa90,
               in_stack_fffffffffffffa88,(QBGPlanner_TreeIncPruneBnB *)in_stack_fffffffffffffa80);
    local_18 = (QFunctionJAOHInterface *)0x0;
    if (in_stack_fffffffffffffa78 != (PlanningUnitDecPOMDPDiscrete *)0x0) {
      local_18 = (QFunctionJAOHInterface *)
                 ((long)&(in_stack_fffffffffffffa78->super_PlanningUnitMADPDiscrete).
                         super_PlanningUnit._vptr_PlanningUnit +
                 (long)(in_stack_fffffffffffffa78->super_PlanningUnitMADPDiscrete).
                       super_PlanningUnit._vptr_PlanningUnit[-0x12]);
    }
  }
  if (local_18 != (QFunctionJAOHInterface *)0x0) {
    if (0 < *local_10) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Instantiated ");
      psVar6 = local_4d8;
      (**(code **)(*(long *)((long)&local_18->field_0x0 + *(long *)((long)*local_18 + -0x60)) + 0x48
                  ))(psVar6,(long)&local_18->field_0x0 + *(long *)((long)*local_18 + -0x60));
      poVar5 = std::operator<<(poVar5,psVar6);
      poVar5 = std::operator<<(poVar5," heuristic.");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_4d8);
    }
    return local_18;
  }
  uVar4 = __cxa_allocate_exception(0x28);
  E::E((E *)in_stack_fffffffffffffa80,(char *)in_stack_fffffffffffffa78);
  __cxa_throw(uVar4,&E::typeinfo,E::~E);
}

Assistant:

QFunctionJAOHInterface* GetQheuristicFromArgs(
    const PlanningUnitDecPOMDPDiscrete* pu,
    const ArgumentHandlers::Arguments &args)
{
    QFunctionJAOHInterface* q=0;
#if 0
    QAVParameters qavParams;
    bool useAV=false;
#endif
    switch(args.qheur)
    {
    case eQMDP:
    case eQheurUndefined: // if undefined,we default to QMDP
        q = new QMDP(pu,false);
        break;
    case eQPOMDP:
        q = new QPOMDP(pu);
        break;
    case eQBG:
        q = new QBG(pu);
        break;
    case eQMDPc:
        q = new QMDP(pu,true);
        break;
    case eQPOMDPav:
    {
        //true means 'use incremental pruning'
        MonahanPOMDPPlanner *M=new MonahanPOMDPPlanner(pu,true);
        M->SetAcceleratedPruningThreshold(args.acceleratedPruningThreshold);
        q = new QAV<MonahanPOMDPPlanner>(pu,M);

        break;
    }
    case eQBGav:
    {
        //true means 'use incremental pruning'
        MonahanBGPlanner *M=new MonahanBGPlanner(pu,true);
        M->SetAcceleratedPruningThreshold(args.acceleratedPruningThreshold);
        q = new QAV<MonahanBGPlanner>(pu,M);

        break;
    }
    case eQHybrid:
        q = GetHybridQheuristicFromArgs(pu,args);
        break;
    case eQPOMDPhybrid:
    {
        ArgumentHandlers::Arguments args1=args;
        args1.QHybridFirstTS=eQPOMDP;
        args1.QHybridLastTS=eQPOMDP;
#if 0 // don't override this any more
        args1.QHybridHorizonLastTimeSteps=0;
#endif
        q = GetHybridQheuristicFromArgs(pu,args1);
        break;
    }
    case eQBGhybrid:
    {
        ArgumentHandlers::Arguments args1=args;
        args1.QHybridFirstTS=eQBG;
        args1.QHybridLastTS=eQBG;
#if 0 // don't override this any more
        args1.QHybridHorizonLastTimeSteps=0;
#endif
        q=GetHybridQheuristicFromArgs(pu,args1);
        break;
    }
    case eQBGTreeIncPrune:
    {
        TreeIncPruneBGPlanner *M=new TreeIncPruneBGPlanner(pu);
        if(args.TreeIPpruneAfterUnion)
            M->SetPruneAfterUnion(true);
        else
            M->SetPruneAfterUnion(false);
        if(args.TreeIPpruneAfterCrossSum)
            M->SetPruneAfterCrossSum(true);
        else
            M->SetPruneAfterCrossSum(false);
        if(args.TreeIPuseVectorCache)
            M->SetUseVectorCache(true);
        else
            M->SetUseVectorCache(false);
            
        q = new QAV<TreeIncPruneBGPlanner>(pu,M);

        break;
    }
    case eQBGTreeIncPruneBnB:
    {
        QBGPlanner_TreeIncPruneBnB *M=new QBGPlanner_TreeIncPruneBnB(pu);
        q = new QAV<QBGPlanner_TreeIncPruneBnB>(pu,M);
        break;
    }
    }
    if(q==0)
        throw(E("argumentUtils::GetQheuristicFromArgs() no Q heuristic instantiated"));

    if(args.verbose>0)
        cout << "Instantiated " << q->SoftPrintBrief() << " heuristic." << endl;
    
    return(q);
}